

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void savelineinfo(FuncState *fs,Proto *f,int line)

{
  lu_byte lVar1;
  int iVar2;
  uint uVar3;
  AbsLineInfo *pAVar4;
  ls_byte *plVar5;
  uint uVar6;
  int nelems;
  long lVar7;
  
  uVar6 = line - fs->previousline;
  lVar7 = (long)fs->pc + -1;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  nelems = (int)lVar7;
  if ((0x7f < uVar3) || (lVar1 = fs->iwthabs, fs->iwthabs = lVar1 + '\x01', (char)lVar1 < '\0')) {
    pAVar4 = (AbsLineInfo *)
             luaM_growaux_(fs->ls->L,f->abslineinfo,fs->nabslineinfo,&f->sizeabslineinfo,8,
                           0x7fffffff,"lines");
    f->abslineinfo = pAVar4;
    iVar2 = fs->nabslineinfo;
    pAVar4[iVar2].pc = nelems;
    fs->nabslineinfo = iVar2 + 1;
    pAVar4[iVar2].line = line;
    fs->iwthabs = '\x01';
    uVar6 = 0xffffff80;
  }
  plVar5 = (ls_byte *)
           luaM_growaux_(fs->ls->L,f->lineinfo,nelems,&f->sizelineinfo,1,0x7fffffff,"opcodes");
  f->lineinfo = plVar5;
  plVar5[lVar7] = (ls_byte)uVar6;
  fs->previousline = line;
  return;
}

Assistant:

static void savelineinfo (FuncState *fs, Proto *f, int line) {
  int linedif = line - fs->previousline;
  int pc = fs->pc - 1;  /* last instruction coded */
  if (abs(linedif) >= LIMLINEDIFF || fs->iwthabs++ >= MAXIWTHABS) {
    luaM_growvector(fs->ls->L, f->abslineinfo, fs->nabslineinfo,
                    f->sizeabslineinfo, AbsLineInfo, INT_MAX, "lines");
    f->abslineinfo[fs->nabslineinfo].pc = pc;
    f->abslineinfo[fs->nabslineinfo++].line = line;
    linedif = ABSLINEINFO;  /* signal that there is absolute information */
    fs->iwthabs = 1;  /* restart counter */
  }
  luaM_growvector(fs->ls->L, f->lineinfo, pc, f->sizelineinfo, ls_byte,
                  INT_MAX, "opcodes");
  f->lineinfo[pc] = cast(ls_byte, linedif);
  fs->previousline = line;  /* last line saved */
}